

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_tostring.c
# Opt level: O0

int mpt_number_tostring(mpt_value *val,mpt_value_format fmt,char *dest,size_t left)

{
  byte bVar1;
  short sVar2;
  ushort uVar3;
  longdouble *plVar4;
  uint uVar5;
  char cVar6;
  uint uVar7;
  undefined8 in_R9;
  longdouble local_1d0;
  longdouble local_1c4;
  longdouble local_1b8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  float local_180;
  float local_17c;
  float local_178;
  float local_174;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  uint local_14c;
  uint local_148;
  uint local_144;
  uint local_140;
  uint local_11c;
  longdouble val_28;
  longdouble val_27;
  longdouble val_26;
  longdouble val_25;
  double val_24;
  double val_23;
  double val_22;
  double val_21;
  float val_20;
  float val_19;
  float val_18;
  float val_17;
  uint64_t val_16;
  uint64_t val_15;
  uint64_t val_14;
  int64_t val_13;
  uint32_t val_12;
  uint32_t val_11;
  uint32_t val_10;
  int32_t val_9;
  uint16_t val_8;
  uint16_t val_7;
  uint16_t val_6;
  int16_t val_5;
  uint8_t val_4;
  uint8_t val_3;
  uint8_t val_2;
  int8_t val_1;
  uint8_t wd;
  int dec;
  int len;
  int sgn;
  int flg;
  uintptr_t type;
  void *arg;
  size_t left_local;
  char *dest_local;
  mpt_value *val_local;
  mpt_value_format fmt_local;
  
  _sgn = val->_type;
  if (_sgn == 0) {
    return -3;
  }
  plVar4 = (longdouble *)val->_addr;
  uVar7 = (uint)fmt & 0x100;
  val_local._2_1_ = fmt.width;
  val_6._1_1_ = val_local._2_1_;
  uVar5 = (uint)fmt >> 0x18;
  if (((uint)fmt & 0x200) == 0) {
    if (left < val_local._2_1_) {
      return -0x11;
    }
  }
  else {
    val_6._1_1_ = 0;
  }
  if (_sgn == 0x6c) {
    cVar6 = mpt_type_int(8);
    _sgn = (mpt_type_t)cVar6;
  }
  switch(_sgn) {
  case 0x62:
    if (((uint)fmt & 0xf) == 0) {
      if (plVar4 == (longdouble *)0x0) {
        cVar6 = '\0';
      }
      else {
        cVar6 = *(char *)plVar4;
      }
      if (uVar7 == 0) {
        _val_3 = snprintf(dest,left,"%*i",(ulong)val_6._1_1_,(ulong)(uint)(int)cVar6);
      }
      else {
        _val_3 = snprintf(dest,left,"%+*i",(ulong)val_6._1_1_,(ulong)(uint)(int)cVar6);
      }
      break;
    }
  case 0x79:
    if (((uint)fmt & 0xf) == 0) {
      if (plVar4 == (longdouble *)0x0) {
        bVar1 = 0;
      }
      else {
        bVar1 = *(byte *)plVar4;
      }
      _val_3 = snprintf(dest,left,"%*u",(ulong)val_6._1_1_,(ulong)bVar1);
    }
    else if (((uint)fmt & 1) == 0) {
      if (((uint)fmt & 2) == 0) {
        return -2;
      }
      if (plVar4 == (longdouble *)0x0) {
        bVar1 = 0;
      }
      else {
        bVar1 = *(byte *)plVar4;
      }
      _val_3 = snprintf(dest,left,"%*o",(ulong)val_6._1_1_,(ulong)bVar1);
    }
    else {
      if (plVar4 == (longdouble *)0x0) {
        bVar1 = 0;
      }
      else {
        bVar1 = *(byte *)plVar4;
      }
      _val_3 = snprintf(dest,left,"%*x",(ulong)val_6._1_1_,(ulong)bVar1);
    }
    break;
  case 99:
    if (plVar4 == (longdouble *)0x0) {
      local_11c = 0;
    }
    else {
      local_11c = (uint)*(char *)plVar4;
    }
    _val_3 = snprintf(dest,left,"%*c",(ulong)val_6._1_1_,(ulong)local_11c);
    break;
  case 100:
    if (uVar5 == 0) {
      if (plVar4 == (longdouble *)0x0) {
        local_188 = 0;
      }
      else {
        local_188 = *(undefined8 *)plVar4;
      }
      if (uVar7 == 0) {
        _val_3 = snprintf(dest,left,"%*g",local_188,(ulong)val_6._1_1_);
      }
      else {
        _val_3 = snprintf(dest,left,"%+*g",local_188,(ulong)val_6._1_1_);
      }
    }
    else if (((uint)fmt & 0xf0) == 0) {
      if (plVar4 == (longdouble *)0x0) {
        local_190 = 0;
      }
      else {
        local_190 = *(undefined8 *)plVar4;
      }
      if (uVar7 == 0) {
        _val_3 = snprintf(dest,left,"%*.*f",local_190,(ulong)val_6._1_1_,(ulong)uVar5);
      }
      else {
        _val_3 = snprintf(dest,left,"%+*.*f",local_190,(ulong)val_6._1_1_,(ulong)uVar5);
      }
    }
    else if (((uint)fmt & 0x10) == 0) {
      if (((uint)fmt & 0x20) == 0) {
        return -2;
      }
      if (plVar4 == (longdouble *)0x0) {
        local_1a0 = 0;
      }
      else {
        local_1a0 = *(undefined8 *)plVar4;
      }
      if (uVar7 == 0) {
        _val_3 = snprintf(dest,left,"%*.*e",local_1a0,(ulong)val_6._1_1_,(ulong)uVar5);
      }
      else {
        _val_3 = snprintf(dest,left,"%+*.*e",local_1a0,(ulong)val_6._1_1_,(ulong)uVar5);
      }
    }
    else {
      if (plVar4 == (longdouble *)0x0) {
        local_198 = 0;
      }
      else {
        local_198 = *(undefined8 *)plVar4;
      }
      if (uVar7 == 0) {
        _val_3 = snprintf(dest,left,"%*.*a",local_198,(ulong)val_6._1_1_,(ulong)uVar5);
      }
      else {
        _val_3 = snprintf(dest,left,"%+*.*a",local_198,(ulong)val_6._1_1_,(ulong)uVar5);
      }
    }
    break;
  case 0x65:
    if (uVar5 == 0) {
      if (uVar7 == 0) {
        _val_3 = snprintf(dest,left,"%*Lg",(ulong)val_6._1_1_);
      }
      else {
        _val_3 = snprintf(dest,left,"%+*Lg",(ulong)val_6._1_1_);
      }
    }
    else if (((uint)fmt & 0xf0) == 0) {
      if (plVar4 == (longdouble *)0x0) {
        local_1b8 = (longdouble)0;
      }
      else {
        local_1b8 = *plVar4;
      }
      if (uVar7 == 0) {
        _val_3 = snprintf(dest,left,"%*.*Lf",(ulong)val_6._1_1_,(ulong)uVar5,in_R9,local_1b8);
      }
      else {
        _val_3 = snprintf(dest,left,"%+*.*Lf",(ulong)val_6._1_1_,(ulong)uVar5,in_R9,local_1b8);
      }
    }
    else if (((uint)fmt & 0x10) == 0) {
      if (((uint)fmt & 0x20) == 0) {
        return -2;
      }
      if (plVar4 == (longdouble *)0x0) {
        local_1d0 = (longdouble)0;
      }
      else {
        local_1d0 = *plVar4;
      }
      if (uVar7 == 0) {
        _val_3 = snprintf(dest,left,"%*.*Le",(ulong)val_6._1_1_,(ulong)uVar5,in_R9,local_1d0);
      }
      else {
        _val_3 = snprintf(dest,left,"%+*.*Le",(ulong)val_6._1_1_,(ulong)uVar5,in_R9,local_1d0);
      }
    }
    else {
      if (plVar4 == (longdouble *)0x0) {
        local_1c4 = (longdouble)0;
      }
      else {
        local_1c4 = *plVar4;
      }
      if (uVar7 == 0) {
        _val_3 = snprintf(dest,left,"%*.*LA",(ulong)val_6._1_1_,(ulong)uVar5,in_R9,local_1c4);
      }
      else {
        _val_3 = snprintf(dest,left,"%+*.*LA",(ulong)val_6._1_1_,(ulong)uVar5,in_R9,local_1c4);
      }
    }
    break;
  case 0x66:
    if (uVar5 == 0) {
      if (plVar4 == (longdouble *)0x0) {
        local_174 = 0.0;
      }
      else {
        local_174 = *(float *)plVar4;
      }
      if (uVar7 == 0) {
        _val_3 = snprintf(dest,left,"%*g",(double)local_174,(ulong)val_6._1_1_);
      }
      else {
        _val_3 = snprintf(dest,left,"%+*g",(double)local_174,(ulong)val_6._1_1_);
      }
    }
    else if (((uint)fmt & 0xf0) == 0) {
      if (plVar4 == (longdouble *)0x0) {
        local_178 = 0.0;
      }
      else {
        local_178 = *(float *)plVar4;
      }
      if (uVar7 == 0) {
        _val_3 = snprintf(dest,left,"%*.*f",(double)local_178,(ulong)val_6._1_1_,(ulong)uVar5);
      }
      else {
        _val_3 = snprintf(dest,left,"%+*.*f",(double)local_178,(ulong)val_6._1_1_,(ulong)uVar5);
      }
    }
    else if (((uint)fmt & 0x10) == 0) {
      if (((uint)fmt & 0x20) == 0) {
        return -2;
      }
      if (plVar4 == (longdouble *)0x0) {
        local_180 = 0.0;
      }
      else {
        local_180 = *(float *)plVar4;
      }
      if (uVar7 == 0) {
        _val_3 = snprintf(dest,left,"%*.*e",(double)local_180,(ulong)val_6._1_1_,(ulong)uVar5);
      }
      else {
        _val_3 = snprintf(dest,left,"%+*.*e",(double)local_180,(ulong)val_6._1_1_,(ulong)uVar5);
      }
    }
    else {
      if (plVar4 == (longdouble *)0x0) {
        local_17c = 0.0;
      }
      else {
        local_17c = *(float *)plVar4;
      }
      if (uVar7 == 0) {
        _val_3 = snprintf(dest,left,"%*.*a",(double)local_17c,(ulong)val_6._1_1_,(ulong)uVar5);
      }
      else {
        _val_3 = snprintf(dest,left,"%*.*a",(double)local_17c,(ulong)val_6._1_1_,(ulong)uVar5);
      }
    }
    break;
  default:
    return -3;
  case 0x69:
    if (((uint)fmt & 0xf) == 0) {
      if (plVar4 == (longdouble *)0x0) {
        local_140 = 0;
      }
      else {
        local_140 = *(uint *)plVar4;
      }
      if (uVar7 == 0) {
        _val_3 = snprintf(dest,left,"%*i",(ulong)val_6._1_1_,(ulong)local_140);
      }
      else {
        _val_3 = snprintf(dest,left,"%+*i",(ulong)val_6._1_1_,(ulong)local_140);
      }
      break;
    }
  case 0x75:
    if (((uint)fmt & 0xf) == 0) {
      if (plVar4 == (longdouble *)0x0) {
        local_144 = 0;
      }
      else {
        local_144 = *(uint *)plVar4;
      }
      _val_3 = snprintf(dest,left,"%*u",(ulong)val_6._1_1_,(ulong)local_144);
    }
    else if (((uint)fmt & 1) == 0) {
      if (((uint)fmt & 2) == 0) {
        return -2;
      }
      if (plVar4 == (longdouble *)0x0) {
        local_14c = 0;
      }
      else {
        local_14c = *(uint *)plVar4;
      }
      _val_3 = snprintf(dest,left,"%*o",(ulong)val_6._1_1_,(ulong)local_14c);
    }
    else {
      if (plVar4 == (longdouble *)0x0) {
        local_148 = 0;
      }
      else {
        local_148 = *(uint *)plVar4;
      }
      _val_3 = snprintf(dest,left,"%*x",(ulong)val_6._1_1_,(ulong)local_148);
    }
    break;
  case 0x6e:
    if (((uint)fmt & 0xf) == 0) {
      if (plVar4 == (longdouble *)0x0) {
        sVar2 = 0;
      }
      else {
        sVar2 = *(short *)plVar4;
      }
      if (uVar7 == 0) {
        _val_3 = snprintf(dest,left,"%*i",(ulong)val_6._1_1_,(ulong)(uint)(int)sVar2);
      }
      else {
        _val_3 = snprintf(dest,left,"%+*i",(ulong)val_6._1_1_,(ulong)(uint)(int)sVar2);
      }
      break;
    }
  case 0x71:
    if (((uint)fmt & 0xf) == 0) {
      if (plVar4 == (longdouble *)0x0) {
        uVar3 = 0;
      }
      else {
        uVar3 = *(ushort *)plVar4;
      }
      _val_3 = snprintf(dest,left,"%*u",(ulong)val_6._1_1_,(ulong)uVar3);
    }
    else if (((uint)fmt & 1) == 0) {
      if (((uint)fmt & 2) == 0) {
        return -2;
      }
      if (plVar4 == (longdouble *)0x0) {
        uVar3 = 0;
      }
      else {
        uVar3 = *(ushort *)plVar4;
      }
      _val_3 = snprintf(dest,left,"%*o",(ulong)val_6._1_1_,(ulong)uVar3);
    }
    else {
      if (plVar4 == (longdouble *)0x0) {
        uVar3 = 0;
      }
      else {
        uVar3 = *(ushort *)plVar4;
      }
      _val_3 = snprintf(dest,left,"%*x",(ulong)val_6._1_1_,(ulong)uVar3);
    }
    break;
  case 0x78:
    if (((uint)fmt & 0xf) == 0) {
      if (plVar4 == (longdouble *)0x0) {
        local_158 = 0;
      }
      else {
        local_158 = *(undefined8 *)plVar4;
      }
      if (uVar7 == 0) {
        _val_3 = snprintf(dest,left,"%*li",(ulong)val_6._1_1_,local_158);
      }
      else {
        _val_3 = snprintf(dest,left,"%+*li",(ulong)val_6._1_1_,local_158);
      }
      break;
    }
  case 0x74:
    if (((uint)fmt & 0xf) == 0) {
      if (plVar4 == (longdouble *)0x0) {
        local_160 = 0;
      }
      else {
        local_160 = *(undefined8 *)plVar4;
      }
      _val_3 = snprintf(dest,left,"%*lu",(ulong)val_6._1_1_,local_160);
    }
    else if (((uint)fmt & 1) == 0) {
      if (((uint)fmt & 2) == 0) {
        return -2;
      }
      if (plVar4 == (longdouble *)0x0) {
        local_170 = 0;
      }
      else {
        local_170 = *(undefined8 *)plVar4;
      }
      _val_3 = snprintf(dest,left,"%*lo",(ulong)val_6._1_1_,local_170);
    }
    else {
      if (plVar4 == (longdouble *)0x0) {
        local_168 = 0;
      }
      else {
        local_168 = *(undefined8 *)plVar4;
      }
      _val_3 = snprintf(dest,left,"%*lx",(ulong)val_6._1_1_,local_168);
    }
  }
  if (_val_3 < 0) {
    val_local._4_4_ = _val_3;
  }
  else if ((ulong)(long)_val_3 < left) {
    val_local._4_4_ = _val_3;
  }
  else {
    val_local._4_4_ = -0x11;
  }
  return val_local._4_4_;
}

Assistant:

extern int mpt_number_tostring(const MPT_STRUCT(value) *val, MPT_STRUCT(value_format) fmt, char *dest, size_t left)
{
	const void *arg;
	uintptr_t type;
	int flg, sgn, len, dec;
	uint8_t wd;
	
	if (!(type = val->_type)) {
		return MPT_ERROR(BadType);
	}
	arg = val->_addr;
	
	flg = fmt.flags & 0xff;
	sgn = fmt.flags & MPT_VALFMT(Sign);
	wd  = fmt.width;
	dec = fmt.dec;
	
	if (fmt.flags & MPT_VALFMT(Left)) {
		wd = 0;
	}
	else if (wd > left) {
		return MPT_ERROR(MissingBuffer);
	}
	if (type == 'l') {
		type = mpt_type_int(sizeof(long));
	}
	switch (type) {
	/* single character */
	    case 'c':
		len = snprintf(dest, left, "%*c", wd, arg ? *((char*)arg) : 0);
		break;
	/* 8bit formats */
	    case 'b':
		if (!(flg & MPT_VALFMT(IntFlags))) {
			int8_t val = arg ? *((int8_t*)arg) : 0;
			if (sgn) {
				len = snprintf(dest, left, "%+*" PRIi8, wd, val);
			} else {
				len = snprintf(dest, left, "%*" PRIi8, wd, val);
			}
			break;
		}
		/* fall through */
	    case 'y':
		if (!(flg & MPT_VALFMT(IntFlags))) {
			uint8_t val = arg ? *((uint8_t*)arg) : 0;
			len = snprintf(dest, left, "%*" PRIu8, wd, val);
			break;
		}
		if (flg & MPT_VALFMT(IntHex)) {
			uint8_t val = arg ? *((uint8_t*)arg) : 0;
			len = snprintf(dest, left, "%*" PRIx8, wd, val);
			break;
		}
		if (flg & MPT_VALFMT(IntOctal)) {
			uint8_t val = arg ? *((uint8_t*)arg) : 0;
			len = snprintf(dest, left, "%*" PRIo8, wd, val);
			break;
		}
		return MPT_ERROR(BadValue);
	/* 16bit formats */
	    case 'n':
		if (!(flg & MPT_VALFMT(IntFlags))) {
			int16_t val = arg ? *((int16_t*)arg) : 0;
			if (sgn) {
				len = snprintf(dest, left, "%+*" PRIi16, wd, val);
			} else {
				len = snprintf(dest, left, "%*" PRIi16, wd, val);
			}
			break;
		}
		/* fall through */
	    case 'q':
		if (!(flg & MPT_VALFMT(IntFlags))) {
			uint16_t val = arg ? *((uint16_t*)arg) : 0;
			len = snprintf(dest, left, "%*" PRIu16, wd, val);
			break;
		}
		if (flg & MPT_VALFMT(IntHex)) {
			uint16_t val = arg ? *((uint16_t*)arg) : 0;
			len = snprintf(dest, left, "%*" PRIx16, wd, val);
			break;
		}
		if (flg & MPT_VALFMT(IntOctal)) {
			uint16_t val = arg ? *((uint16_t*)arg) : 0;
			len = snprintf(dest, left, "%*" PRIo16, wd, val);
			break;
		}
		return MPT_ERROR(BadValue);
	/* 32bit formats */
	    case 'i':
		if (!(flg & MPT_VALFMT(IntFlags))) {
			int32_t val = arg ? *((int32_t*)arg) : 0;
			if (sgn) {
				len = snprintf(dest, left, "%+*" PRIi32, wd, val);
			} else {
				len = snprintf(dest, left, "%*" PRIi32, wd, val);
			}
			break;
		}
		/* fall through */
	    case 'u':
		if (!(flg & MPT_VALFMT(IntFlags))) {
			uint32_t val = arg ? *((uint32_t*)arg) : 0;
			len = snprintf(dest, left, "%*" PRIu32, wd, val);
			break;
		}
		if (flg & MPT_VALFMT(IntHex)) {
			uint32_t val = arg ? *((uint32_t*)arg) : 0;
			len = snprintf(dest, left, "%*" PRIx32, wd, val);
			break;
		}
		if (flg & MPT_VALFMT(IntOctal)) {
			uint32_t val = arg ? *((uint32_t*)arg) : 0;
			len = snprintf(dest, left, "%*" PRIo32, wd, val);
			break;
		}
		return MPT_ERROR(BadValue);
	/* 64bit formats */
	    case 'x':
		if (!(flg & MPT_VALFMT(IntFlags))) {
			int64_t val = arg ? *((int64_t*)arg) : 0;
			if (sgn) {
				len = snprintf(dest, left, "%+*" PRIi64, wd, val);
			} else {
				len = snprintf(dest, left, "%*" PRIi64, wd, val);
			}
			break;
		}
		/* fall through */
	    case 't':
		if (!(flg & MPT_VALFMT(IntFlags))) {
			uint64_t val = arg ? *((uint64_t*)arg) : 0;
			len = snprintf(dest, left, "%*" PRIu64, wd, val);
			break;
		}
		if (flg & MPT_VALFMT(IntHex)) {
			uint64_t val = arg ? *((uint64_t*)arg) : 0;
			len = snprintf(dest, left, "%*" PRIx64, wd, val);
			break;
		}
		if (flg & MPT_VALFMT(IntOctal)) {
			uint64_t val = arg ? *((uint64_t*)arg) : 0;
			len = snprintf(dest, left, "%*" PRIo64, wd, val);
			break;
		}
		return MPT_ERROR(BadValue);
	/* floating point formats */
	    case 'f':
		if (!dec) {
			float val = arg ? *((float*)arg) : 0;
			if (sgn) {
				len = snprintf(dest, left, "%+*g", wd, val);
			} else {
				len = snprintf(dest, left, "%*g", wd, val);
			}
			break;
		}
		if (!(flg & MPT_VALFMT(FltFlags))) {
			float val = arg ? *((float*)arg) : 0;
			if (sgn) {
				len = snprintf(dest, left, "%+*.*f", wd, dec, val);
			} else {
				len = snprintf(dest, left, "%*.*f", wd, dec, val);
			}
			break;
		}
#if __STDC_VERSION__ >= 199901L
		if (flg & MPT_VALFMT(FltHex)) {
			float val = arg ? *((float*)arg) : 0;
			if (sgn) {
				len = snprintf(dest, left, "%*.*a", wd, dec, val);
			} else {
				len = snprintf(dest, left, "%*.*a", wd, dec, val);
			}
			break;
		}
#endif
		if (flg & MPT_VALFMT(Scientific)) {
			float val = arg ? *((float*)arg) : 0;
			if (sgn) {
				len = snprintf(dest, left, "%+*.*e", wd, dec, val);
			} else {
				len = snprintf(dest, left, "%*.*e", wd, dec, val);
			}
			break;
		}
		return MPT_ERROR(BadValue);
	    case 'd':
		if (!dec) {
			double val = arg ? *((double*)arg) : 0;
			if (sgn) {
				len = snprintf(dest, left, "%+*g", wd, val);
			} else {
				len = snprintf(dest, left, "%*g", wd, val);
			}
			break;
		}
		if (!(flg & MPT_VALFMT(FltFlags))) {
			double val = arg ? *((double*)arg) : 0;
			if (sgn) {
				len = snprintf(dest, left, "%+*.*f", wd, dec, val);
			} else {
				len = snprintf(dest, left, "%*.*f", wd, dec, val);
			}
			break;
		}
#if __STDC_VERSION__ >= 199901L
		if (flg & MPT_VALFMT(FltHex)) {
			double val = arg ? *((double*)arg) : 0;
			if (sgn) {
				len = snprintf(dest, left, "%+*.*a", wd, dec, val);
			} else {
				len = snprintf(dest, left, "%*.*a", wd, dec, val);
			}
			break;
		}
#endif
		if (flg & MPT_VALFMT(Scientific)) {
			double val = arg ? *((double*)arg) : 0;
			if (sgn) {
				len = snprintf(dest, left, "%+*.*e", wd, dec, val);
			} else {
				len = snprintf(dest, left, "%*.*e", wd, dec, val);
			}
			break;
		}
		return MPT_ERROR(BadValue);
#ifdef _MPT_FLOAT_EXTENDED_H
	    case 'e':
		if (!dec) {
			long double val = arg ? *((long double*)arg) : 0;
			if (sgn) {
				len = snprintf(dest, left, "%+*Lg", wd, val);
			} else {
				len = snprintf(dest, left, "%*Lg", wd, val);
			}
			break;
		}
		if (!(flg & MPT_VALFMT(FltFlags))) {
			long double val = arg ? *((long double*)arg) : 0;
			if (sgn) {
				len = snprintf(dest, left, "%+*.*Lf", wd, dec, val);
			} else {
				len = snprintf(dest, left, "%*.*Lf", wd, dec, val);
			}
			break;
		}
# if __STDC_VERSION__ >= 199901L
		if (flg & MPT_VALFMT(FltHex)) {
			long double val = arg ? *((long double*)arg) : 0;
			if (sgn) {
				len = snprintf(dest, left, "%+*.*LA", wd, dec, val);
			} else {
				len = snprintf(dest, left, "%*.*LA", wd, dec, val);
			}
			break;
		}
# endif
		if (flg & MPT_VALFMT(Scientific)) {
			long double val = arg ? *((long double*)arg) : 0;
			if (sgn) {
				len = snprintf(dest, left, "%+*.*Le", wd, dec, val);
			} else {
				len = snprintf(dest, left, "%*.*Le", wd, dec, val);
			}
			break;
		}
		return MPT_ERROR(BadValue);
#endif /* _MPT_FLOAT_EXTENDED_H */
	    default:
		return MPT_ERROR(BadType);
	}
	if (len < 0) {
		return len;
	}
	if ((size_t) len >= left) {
		return MPT_ERROR(MissingBuffer);
	}
	if (flg & MPT_VALFMT(Left)) {
		wd = fmt.width;
		if (left < (size_t) wd) {
			return MPT_ERROR(MissingBuffer);
		}
		wd -= len;
		while (wd-- > 0) {
			dest[len++] = ' ';
		}
		if ((size_t) len < left) {
			dest[len] = 0;
		}
	}
	return len;
}